

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetPropDelay(Wln_Ret_t *p)

{
  int iVar1;
  int iVar2;
  int i;
  
  (p->vSinks).nSize = 0;
  iVar2 = 0;
  i = 1;
  while( true ) {
    if ((p->pNtk->vTypes).nSize <= i) break;
    iVar1 = Wln_ObjIsCio(p->pNtk,i);
    if (iVar1 == 0) {
      iVar1 = Wln_RetPropDelay_rec(p,i);
      if (iVar2 == iVar1) {
        Vec_IntPush(&p->vSinks,i);
      }
      else if (iVar2 < iVar1) {
        Vec_IntFill(&p->vSinks,1,i);
        iVar2 = iVar1;
      }
    }
    i = i + 1;
  }
  return iVar2;
}

Assistant:

int Wln_RetPropDelay( Wln_Ret_t * p )
{
    int iObj, DelayMax = 0;
    Vec_IntClear( &p->vSinks );
    Wln_NtkForEachObj( p->pNtk, iObj )
        if ( !Wln_ObjIsCio(p->pNtk, iObj) )
        {
            int Delay = Wln_RetPropDelay_rec(p, iObj);
            if ( DelayMax == Delay )
                Vec_IntPush( &p->vSinks, iObj );
            else if ( DelayMax < Delay )
            {
                DelayMax = Delay;
                Vec_IntFill( &p->vSinks, 1, iObj );
            }
        }

//    Vec_IntForEachEntry( &p->vPathDelays, iObj, i )
//        printf( "Obj = %d.  Delay = %d.\n", i, iObj );
//    printf( "\n" );

//    printf( "Sinks: " );
//    Vec_IntPrint( &p->vSinks );

    return DelayMax;
}